

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O3

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  uint uVar6;
  pointer pnVar7;
  Item *pIVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  int iVar10;
  undefined4 *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  long lVar13;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  uint *puVar15;
  undefined8 *puVar16;
  undefined4 *puVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  undefined4 *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  char cVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  long in_FS_OFFSET;
  bool bVar30;
  byte bVar31;
  Real a;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_63;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nne;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_49;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_free;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_free;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  undefined1 local_d18 [16];
  undefined1 local_d08 [16];
  undefined1 local_cf8 [16];
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [16];
  undefined1 local_cc8 [16];
  uint local_cb8 [3];
  undefined3 uStack_cab;
  int iStack_ca8;
  bool bStack_ca4;
  double local_ca0;
  double local_c98;
  undefined8 uStack_c90;
  double local_c88;
  undefined8 uStack_c80;
  undefined1 local_c78 [128];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_bf8;
  undefined8 uStack_bf0;
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [16];
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [16];
  undefined1 local_b98 [16];
  uint local_b88 [3];
  undefined3 uStack_b7b;
  int iStack_b78;
  bool bStack_b74;
  double local_b70;
  undefined1 local_b68 [32];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [13];
  undefined3 uStack_afb;
  int iStack_af8;
  bool bStack_af4;
  double local_af0;
  undefined1 local_ae8 [32];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [13];
  undefined3 uStack_a7b;
  int iStack_a78;
  bool bStack_a74;
  double local_a70;
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  uint local_a08 [3];
  undefined3 uStack_9fb;
  int iStack_9f8;
  bool bStack_9f4;
  double local_9f0;
  undefined1 local_9e8 [32];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [13];
  undefined3 uStack_97b;
  int iStack_978;
  bool bStack_974;
  double local_970;
  double local_968;
  undefined8 uStack_960;
  undefined1 local_958 [32];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [13];
  undefined3 uStack_8eb;
  int iStack_8e8;
  bool bStack_8e4;
  double local_8e0;
  undefined1 local_8d8 [128];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8 [3];
  undefined3 uStack_7eb;
  int iStack_7e8;
  bool bStack_7e4;
  double local_7e0;
  cpp_dec_float<200U,_int,_void> local_7d8;
  double local_758;
  undefined8 uStack_750;
  undefined1 local_748 [120];
  double local_6d0;
  cpp_dec_float<200U,_int,_void> local_6c8;
  cpp_dec_float<200U,_int,_void> local_648;
  undefined1 local_5c8 [120];
  double local_550;
  cpp_dec_float<200U,_int,_void> local_548;
  undefined1 local_4c8 [120];
  double local_450;
  undefined1 local_448 [128];
  double local_3c8;
  undefined8 uStack_3c0;
  undefined1 local_3b8 [120];
  double local_340;
  undefined1 local_338 [128];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined5 uStack_250;
  undefined3 uStack_24b;
  int iStack_248;
  byte bStack_244;
  double local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined5 uStack_1d0;
  undefined3 uStack_1cb;
  int iStack_1c8;
  byte bStack_1c4;
  double local_1c0;
  undefined1 local_1b8 [120];
  double local_140;
  undefined1 local_138 [120];
  double local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 local_40;
  
  bVar31 = 0;
  a = Tolerances::epsilon((base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x1c;
  local_b8._0_16_ = (undefined1  [16])0x0;
  local_b8._16_16_ = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  uStack_48._0_4_ = 0;
  uStack_48._4_1_ = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_b8,a);
  local_7d8.fpclass = cpp_dec_float_finite;
  local_7d8.prec_elem = 0x1c;
  local_7d8.data._M_elems[0] = 0;
  local_7d8.data._M_elems[1] = 0;
  local_7d8.data._M_elems[2] = 0;
  local_7d8.data._M_elems[3] = 0;
  local_7d8.data._M_elems[4] = 0;
  local_7d8.data._M_elems[5] = 0;
  local_7d8.data._M_elems[6] = 0;
  local_7d8.data._M_elems[7] = 0;
  local_7d8.data._M_elems[8] = 0;
  local_7d8.data._M_elems[9] = 0;
  local_7d8.data._M_elems[10] = 0;
  local_7d8.data._M_elems[0xb] = 0;
  local_7d8.data._M_elems[0xc] = 0;
  local_7d8.data._M_elems[0xd] = 0;
  local_7d8.data._M_elems[0xe] = 0;
  local_7d8.data._M_elems[0xf] = 0;
  local_7d8.data._M_elems[0x10] = 0;
  local_7d8.data._M_elems[0x11] = 0;
  local_7d8.data._M_elems[0x12] = 0;
  local_7d8.data._M_elems[0x13] = 0;
  local_7d8.data._M_elems[0x14] = 0;
  local_7d8.data._M_elems[0x15] = 0;
  local_7d8.data._M_elems[0x16] = 0;
  local_7d8.data._M_elems[0x17] = 0;
  local_7d8.data._M_elems[0x18] = 0;
  local_7d8.data._M_elems[0x19] = 0;
  local_7d8.data._M_elems._104_5_ = 0;
  local_7d8.data._M_elems[0x1b]._1_3_ = 0;
  local_7d8.exp = 0;
  local_7d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_7d8,1.0);
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_bf8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    uStack_bf0 = 0;
    local_c98 = -(double)local_bf8;
    uStack_c90 = 0x8000000000000000;
    lVar25 = 0;
    lVar24 = 0;
    do {
      pnVar7 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_ca0 = 5.94158821470276e-313;
      local_d18 = (undefined1  [16])0x0;
      local_d08 = (undefined1  [16])0x0;
      local_cf8 = (undefined1  [16])0x0;
      local_ce8 = (undefined1  [16])0x0;
      local_cd8 = (undefined1  [16])0x0;
      local_cc8 = (undefined1  [16])0x0;
      local_cb8[0] = 0;
      local_cb8[1] = 0;
      stack0xfffffffffffff350 = 0;
      uStack_cab = 0;
      iStack_ca8 = 0;
      bStack_ca4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d18,(double)local_bf8);
      if (((*(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x78) != 2) &&
          (local_ca0._0_4_ != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)&(pnVar7->m_backend).data + lVar25),
                              (cpp_dec_float<200U,_int,_void> *)local_d18), iVar10 < 0)) {
        pnVar7 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar10 = *(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x70);
        bVar5 = *(byte *)((long)&(pnVar7->m_backend).data + lVar25 + 0x74);
        dVar27 = *(double *)((long)&(pnVar7->m_backend).data + lVar25 + 0x78);
        uStack_c80 = 0;
        local_c88 = dVar27;
        memmove(local_ae8,(void *)((long)&(pnVar7->m_backend).data + lVar25),0x70);
        bStack_a74 = (bool)bVar5;
        if ((bVar5 == 1) && (local_ae8._0_4_ != 0 || local_c88._0_4_ != 0)) {
          bStack_a74 = false;
        }
        iStack_a78 = iVar10;
        local_a70 = dVar27;
        if (((local_c88._0_4_ != 2) && (bVar30 = local_7d8.fpclass != cpp_dec_float_NaN, bVar30)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_ae8,&local_7d8), 0 < iVar10)
           ) {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar19 = (uint *)((long)&(pnVar7->m_backend).data + lVar25);
          uVar6 = *puVar19;
          puVar15 = puVar19 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar31 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          }
          cVar23 = (char)puVar19[0x1d];
          uVar2._0_4_ = puVar19[0x1e];
          uVar2._4_4_ = puVar19[0x1f];
          if (cVar23 == '\x01') {
            cVar23 = (fpclass_type)uVar2 == cpp_dec_float_finite && uVar6 == 0;
          }
          iVar10 = *(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x70);
          local_7d8.data._M_elems[0] = uVar6;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          puVar19 = local_7d8.data._M_elems + 1;
          for (lVar13 = 0x1b; local_7d8.exp = iVar10, local_7d8.neg = (bool)cVar23,
              local_7d8._120_8_ = uVar2, lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
        }
      }
      pnVar7 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_ca0 = 5.94158821470276e-313;
      local_d18 = (undefined1  [16])0x0;
      local_d08 = (undefined1  [16])0x0;
      local_cf8 = (undefined1  [16])0x0;
      local_ce8 = (undefined1  [16])0x0;
      local_cd8 = (undefined1  [16])0x0;
      local_cc8 = (undefined1  [16])0x0;
      local_cb8[0] = 0;
      local_cb8[1] = 0;
      stack0xfffffffffffff350 = 0;
      uStack_cab = 0;
      iStack_ca8 = 0;
      bStack_ca4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d18,local_c98);
      if (((*(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x78) != 2) &&
          (local_ca0._0_4_ != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)&(pnVar7->m_backend).data + lVar25),
                              (cpp_dec_float<200U,_int,_void> *)local_d18), 0 < iVar10)) {
        pnVar7 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar10 = *(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x70);
        bVar5 = *(byte *)((long)&(pnVar7->m_backend).data + lVar25 + 0x74);
        dVar27 = *(double *)((long)&(pnVar7->m_backend).data + lVar25 + 0x78);
        uStack_c80 = 0;
        local_c88 = dVar27;
        memmove(local_ae8,(void *)((long)&(pnVar7->m_backend).data + lVar25),0x70);
        bStack_a74 = (bool)bVar5;
        if ((bVar5 == 1) && (local_ae8._0_4_ != 0 || local_c88._0_4_ != 0)) {
          bStack_a74 = false;
        }
        iStack_a78 = iVar10;
        local_a70 = dVar27;
        if (((local_c88._0_4_ != 2) && (bVar30 = local_7d8.fpclass != cpp_dec_float_NaN, bVar30)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_ae8,&local_7d8), 0 < iVar10)
           ) {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar19 = (uint *)((long)&(pnVar7->m_backend).data + lVar25);
          uVar6 = *puVar19;
          puVar15 = puVar19 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar31 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          }
          cVar23 = (char)puVar19[0x1d];
          uVar1._0_4_ = puVar19[0x1e];
          uVar1._4_4_ = puVar19[0x1f];
          if (cVar23 == '\x01') {
            cVar23 = (fpclass_type)uVar1 == cpp_dec_float_finite && uVar6 == 0;
          }
          iVar10 = *(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x70);
          local_7d8.data._M_elems[0] = uVar6;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          puVar19 = local_7d8.data._M_elems + 1;
          for (lVar13 = 0x1b; local_7d8.exp = iVar10, local_7d8.neg = (bool)cVar23,
              local_7d8._120_8_ = uVar1, lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
        }
      }
      lVar24 = lVar24 + 1;
      lVar25 = lVar25 + 0x80;
    } while (lVar24 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_bf8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    uStack_bf0 = 0;
    local_c98 = -(double)local_bf8;
    uStack_c90 = 0x8000000000000000;
    lVar25 = 0;
    lVar24 = 0;
    do {
      pnVar7 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_ca0 = 5.94158821470276e-313;
      local_d18 = (undefined1  [16])0x0;
      local_d08 = (undefined1  [16])0x0;
      local_cf8 = (undefined1  [16])0x0;
      local_ce8 = (undefined1  [16])0x0;
      local_cd8 = (undefined1  [16])0x0;
      local_cc8 = (undefined1  [16])0x0;
      local_cb8[0] = 0;
      local_cb8[1] = 0;
      stack0xfffffffffffff350 = 0;
      uStack_cab = 0;
      iStack_ca8 = 0;
      bStack_ca4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d18,(double)local_bf8);
      if (((*(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x78) != 2) &&
          (local_ca0._0_4_ != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)&(pnVar7->m_backend).data + lVar25),
                              (cpp_dec_float<200U,_int,_void> *)local_d18), iVar10 < 0)) {
        pnVar7 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar10 = *(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x70);
        bVar5 = *(byte *)((long)&(pnVar7->m_backend).data + lVar25 + 0x74);
        dVar27 = *(double *)((long)&(pnVar7->m_backend).data + lVar25 + 0x78);
        uStack_c80 = 0;
        local_c88 = dVar27;
        memmove(local_ae8,(void *)((long)&(pnVar7->m_backend).data + lVar25),0x70);
        bStack_a74 = (bool)bVar5;
        if ((bVar5 == 1) && (local_ae8._0_4_ != 0 || local_c88._0_4_ != 0)) {
          bStack_a74 = false;
        }
        iStack_a78 = iVar10;
        local_a70 = dVar27;
        if (((local_c88._0_4_ != 2) && (bVar30 = local_7d8.fpclass != cpp_dec_float_NaN, bVar30)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_ae8,&local_7d8), 0 < iVar10)
           ) {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar19 = (uint *)((long)&(pnVar7->m_backend).data + lVar25);
          uVar6 = *puVar19;
          puVar15 = puVar19 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar31 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          }
          cVar23 = (char)puVar19[0x1d];
          uVar4._0_4_ = puVar19[0x1e];
          uVar4._4_4_ = puVar19[0x1f];
          if (cVar23 == '\x01') {
            cVar23 = (fpclass_type)uVar4 == cpp_dec_float_finite && uVar6 == 0;
          }
          iVar10 = *(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x70);
          local_7d8.data._M_elems[0] = uVar6;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          puVar19 = local_7d8.data._M_elems + 1;
          for (lVar13 = 0x1b; local_7d8.exp = iVar10, local_7d8.neg = (bool)cVar23,
              local_7d8._120_8_ = uVar4, lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
        }
      }
      pnVar7 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_ca0 = 5.94158821470276e-313;
      local_d18 = (undefined1  [16])0x0;
      local_d08 = (undefined1  [16])0x0;
      local_cf8 = (undefined1  [16])0x0;
      local_ce8 = (undefined1  [16])0x0;
      local_cd8 = (undefined1  [16])0x0;
      local_cc8 = (undefined1  [16])0x0;
      local_cb8[0] = 0;
      local_cb8[1] = 0;
      stack0xfffffffffffff350 = 0;
      uStack_cab = 0;
      iStack_ca8 = 0;
      bStack_ca4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d18,local_c98);
      if (((*(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x78) != 2) &&
          (local_ca0._0_4_ != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)
                              ((long)&(pnVar7->m_backend).data + lVar25),
                              (cpp_dec_float<200U,_int,_void> *)local_d18), 0 < iVar10)) {
        pnVar7 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar10 = *(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x70);
        bVar5 = *(byte *)((long)&(pnVar7->m_backend).data + lVar25 + 0x74);
        dVar27 = *(double *)((long)&(pnVar7->m_backend).data + lVar25 + 0x78);
        uStack_c80 = 0;
        local_c88 = dVar27;
        memmove(local_ae8,(void *)((long)&(pnVar7->m_backend).data + lVar25),0x70);
        bStack_a74 = (bool)bVar5;
        if ((bVar5 == 1) && (local_ae8._0_4_ != 0 || local_c88._0_4_ != 0)) {
          bStack_a74 = false;
        }
        iStack_a78 = iVar10;
        local_a70 = dVar27;
        if (((local_c88._0_4_ != 2) && (bVar30 = local_7d8.fpclass != cpp_dec_float_NaN, bVar30)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_ae8,&local_7d8), 0 < iVar10)
           ) {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar19 = (uint *)((long)&(pnVar7->m_backend).data + lVar25);
          uVar6 = *puVar19;
          puVar15 = puVar19 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar31 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          }
          cVar23 = (char)puVar19[0x1d];
          uVar3._0_4_ = puVar19[0x1e];
          uVar3._4_4_ = puVar19[0x1f];
          if (cVar23 == '\x01') {
            cVar23 = (fpclass_type)uVar3 == cpp_dec_float_finite && uVar6 == 0;
          }
          iVar10 = *(int *)((long)&(pnVar7->m_backend).data + lVar25 + 0x70);
          local_7d8.data._M_elems[0] = uVar6;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          puVar19 = local_7d8.data._M_elems + 1;
          for (lVar13 = 0x1b; local_7d8.exp = iVar10, local_7d8.neg = (bool)cVar23,
              local_7d8._120_8_ = uVar3, lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
        }
      }
      lVar24 = lVar24 + 1;
      lVar25 = lVar25 + 0x80;
    } while (lVar24 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  pVVar14 = &(base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object;
  if (base->theType * base->theRep < 1) {
    local_bf8 = pVVar14;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_ae8,pVVar14);
    local_7e0 = 5.94158821470276e-313;
    local_858 = (undefined1  [16])0x0;
    local_848 = (undefined1  [16])0x0;
    local_838 = (undefined1  [16])0x0;
    local_828 = (undefined1  [16])0x0;
    local_818 = (undefined1  [16])0x0;
    local_808 = (undefined1  [16])0x0;
    local_7f8[0] = 0;
    local_7f8[1] = 0;
    stack0xfffffffffffff810 = 0;
    uStack_7eb = 0;
    iStack_7e8 = 0;
    bStack_7e4 = false;
    local_ca0 = 5.94158821470276e-313;
    local_d18 = (undefined1  [16])0x0;
    local_d08 = (undefined1  [16])0x0;
    local_cf8 = (undefined1  [16])0x0;
    local_ce8 = (undefined1  [16])0x0;
    local_cd8 = (undefined1  [16])0x0;
    local_cc8 = (undefined1  [16])0x0;
    local_cb8[0] = 0;
    local_cb8[1] = 0;
    stack0xfffffffffffff350 = 0;
    uStack_cab = 0;
    iStack_ca8 = 0;
    bStack_ca4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_d18,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_858,
               (cpp_dec_float<200U,_int,_void> *)local_d18,
               (cpp_dec_float<200U,_int,_void> *)local_ae8);
    local_6d0 = 5.94158821470276e-313;
    local_748._0_4_ = 0;
    local_748._4_4_ = 0;
    local_748._8_4_ = 0;
    local_748._12_4_ = 0;
    local_748._16_4_ = 0;
    local_748._20_4_ = 0;
    local_748._24_4_ = 0;
    local_748._28_4_ = 0;
    local_748._32_4_ = 0;
    local_748._36_4_ = 0;
    local_748._40_4_ = 0;
    local_748._44_4_ = 0;
    local_748._48_4_ = 0;
    local_748._52_4_ = 0;
    local_748._56_4_ = 0;
    local_748._60_4_ = 0;
    local_748._64_4_ = 0;
    local_748._68_4_ = 0;
    local_748._72_4_ = 0;
    local_748._76_4_ = 0;
    local_748._80_4_ = 0;
    local_748._84_4_ = 0;
    local_748._88_4_ = 0;
    local_748._92_4_ = 0;
    local_748._96_4_ = 0;
    local_748._100_4_ = 0;
    local_748._104_5_ = 0;
    local_748._109_3_ = 0;
    local_748._112_4_ = 0;
    local_748[0x74] = false;
    local_ca0 = 5.94158821470276e-313;
    local_d18 = ZEXT816(0);
    local_d08 = ZEXT816(0);
    local_cf8 = ZEXT816(0);
    local_ce8 = ZEXT816(0);
    local_cd8 = ZEXT816(0);
    local_cc8 = ZEXT816(0);
    local_cb8[0] = 0;
    local_cb8[1] = 0;
    stack0xfffffffffffff350 = 0;
    uStack_cab = 0;
    iStack_ca8 = 0;
    bStack_ca4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_d18,0.01);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_748,
               (cpp_dec_float<200U,_int,_void> *)local_d18,&local_7d8);
    local_ca0 = 5.94158821470276e-313;
    local_d18 = ZEXT816(0);
    local_d08 = ZEXT816(0);
    local_cf8 = ZEXT816(0);
    local_ce8 = ZEXT816(0);
    local_cd8 = ZEXT816(0);
    local_cc8 = ZEXT816(0);
    local_cb8[0] = 0;
    local_cb8[1] = 0;
    stack0xfffffffffffff350 = 0;
    uStack_cab = 0;
    iStack_ca8 = 0;
    bStack_ca4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_d18,0.0001);
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_748;
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_138;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
    }
    local_138._112_4_ = local_748._112_4_;
    local_138[0x74] = local_748[0x74];
    local_c0 = local_6d0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              ((cpp_dec_float<200U,_int,_void> *)local_138,
               (cpp_dec_float<200U,_int,_void> *)local_d18);
    local_140 = 5.94158821470276e-313;
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    local_1b8._8_4_ = 0;
    local_1b8._12_4_ = 0;
    local_1b8._16_4_ = 0;
    local_1b8._20_4_ = 0;
    local_1b8._24_4_ = 0;
    local_1b8._28_4_ = 0;
    local_1b8._32_4_ = 0;
    local_1b8._36_4_ = 0;
    local_1b8._40_4_ = 0;
    local_1b8._44_4_ = 0;
    local_1b8._48_4_ = 0;
    local_1b8._52_4_ = 0;
    local_1b8._56_4_ = 0;
    local_1b8._60_4_ = 0;
    local_1b8._64_4_ = 0;
    local_1b8._68_4_ = 0;
    local_1b8._72_4_ = 0;
    local_1b8._76_4_ = 0;
    local_1b8._80_4_ = 0;
    local_1b8._84_4_ = 0;
    local_1b8._88_4_ = 0;
    local_1b8._92_4_ = 0;
    local_1b8._96_4_ = 0;
    local_1b8._100_4_ = 0;
    local_1b8._104_5_ = 0;
    local_1b8._109_3_ = 0;
    local_1b8._112_4_ = 0;
    local_1b8[0x74] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_1b8,100000.0);
    local_1c0 = 5.94158821470276e-313;
    local_238 = 0;
    uStack_230 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1cb = 0;
    iStack_1c8 = 0;
    bStack_1c4 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_238,10000.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_338,1,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_4c8,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_448,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_3b8,0,(type *)0x0);
    local_240 = 5.94158821470276e-313;
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_24b = 0;
    iStack_248 = 0;
    bStack_244 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2b8,-10000.0);
    local_9f0 = 5.94158821470276e-313;
    local_a68 = ZEXT816(0);
    local_a58 = ZEXT816(0);
    local_a48 = ZEXT816(0);
    local_a38 = ZEXT816(0);
    local_a28 = ZEXT816(0);
    local_a18 = ZEXT816(0);
    local_a08[0] = 0;
    local_a08[1] = 0;
    stack0xfffffffffffff600 = 0;
    uStack_9fb = 0;
    iStack_9f8 = 0;
    bStack_9f4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_a68,-100000.0);
    lVar24 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar24) {
      local_c88 = *(double *)(in_FS_OFFSET + -8);
      uStack_c80 = 0;
      local_968 = -local_c88;
      uStack_960 = 0x8000000000000000;
      local_c98 = (double)(lVar24 + 1);
      lVar24 = lVar24 << 7;
      do {
        local_a70 = 5.94158821470276e-313;
        local_ae8._0_16_ = (undefined1  [16])0x0;
        local_ae8._16_16_ = (undefined1  [16])0x0;
        local_ac8 = (undefined1  [16])0x0;
        local_ab8 = (undefined1  [16])0x0;
        local_aa8 = (undefined1  [16])0x0;
        local_a98 = (undefined1  [16])0x0;
        local_a88 = SUB1613((undefined1  [16])0x0,0);
        uStack_a7b = 0;
        iStack_a78 = 0;
        bStack_a74 = false;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_d18,
                   (long)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[(long)local_c98 - 2].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused + -1,(type *)0x0);
        puVar19 = (uint *)local_138;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ae8;
        for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
        }
        iStack_a78 = local_138._112_4_;
        bStack_a74 = local_138[0x74];
        local_a70 = local_c0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                   (cpp_dec_float<200U,_int,_void> *)local_d18);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
        local_970 = 5.94158821470276e-313;
        local_9e8._0_16_ = (undefined1  [16])0x0;
        local_9e8._16_16_ = (undefined1  [16])0x0;
        local_9c8 = (undefined1  [16])0x0;
        local_9b8 = (undefined1  [16])0x0;
        local_9a8 = (undefined1  [16])0x0;
        local_998 = (undefined1  [16])0x0;
        local_988 = SUB1613((undefined1  [16])0x0,0);
        uStack_97b = 0;
        iStack_978 = 0;
        bStack_974 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_858;
        if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_9e8) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
          }
          iStack_978 = iStack_7e8;
          bStack_974 = bStack_7e4;
          local_970 = local_7e0;
          pcVar12 = pcVar18;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_9e8,pcVar12);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
        local_8e0 = 5.94158821470276e-313;
        local_958._0_16_ = (undefined1  [16])0x0;
        local_958._16_16_ = (undefined1  [16])0x0;
        local_938 = (undefined1  [16])0x0;
        local_928 = (undefined1  [16])0x0;
        local_918 = (undefined1  [16])0x0;
        local_908 = (undefined1  [16])0x0;
        local_8f8 = SUB1613((undefined1  [16])0x0,0);
        uStack_8eb = 0;
        iStack_8e8 = 0;
        bStack_8e4 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_748;
        if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_958) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_958;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
          }
          iStack_8e8 = local_748._112_4_;
          bStack_8e4 = local_748[0x74];
          local_8e0 = local_6d0;
          pcVar12 = pcVar18;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_958,pcVar12);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
        local_b70 = 5.94158821470276e-313;
        local_be8 = (undefined1  [16])0x0;
        local_bd8 = (undefined1  [16])0x0;
        local_bc8 = (undefined1  [16])0x0;
        local_bb8 = (undefined1  [16])0x0;
        local_ba8 = (undefined1  [16])0x0;
        local_b98 = (undefined1  [16])0x0;
        local_b88[0] = 0;
        local_b88[1] = 0;
        stack0xfffffffffffff480 = 0;
        uStack_b7b = 0;
        iStack_b78 = 0;
        bStack_b74 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_748;
        if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_be8) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_be8;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
          }
          iStack_b78 = local_748._112_4_;
          bStack_b74 = local_748[0x74];
          local_b70 = local_6d0;
          pcVar12 = pcVar18;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_be8,pcVar12);
        pnVar7 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_ca0 = 5.94158821470276e-313;
        local_d18 = (undefined1  [16])0x0;
        local_d08 = (undefined1  [16])0x0;
        local_cf8 = (undefined1  [16])0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8[0] = 0;
        local_cb8[1] = 0;
        stack0xfffffffffffff350 = 0;
        uStack_cab = 0;
        iStack_ca8 = 0;
        bStack_ca4 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_d18,local_c88);
        if (((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) == 2) ||
            (local_ca0._0_4_ == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)&pnVar7[-1].m_backend.data + lVar24),
                                (cpp_dec_float<200U,_int,_void> *)local_d18), -1 < iVar10)) {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_ca0 = 5.94158821470276e-313;
          local_d18 = ZEXT816(0);
          local_d08 = ZEXT816(0);
          local_cf8 = ZEXT816(0);
          local_ce8 = ZEXT816(0);
          local_cd8 = ZEXT816(0);
          local_cc8 = ZEXT816(0);
          local_cb8[0] = 0;
          local_cb8[1] = 0;
          stack0xfffffffffffff350 = 0;
          uStack_cab = 0;
          iStack_ca8 = 0;
          bStack_ca4 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_d18,local_968);
          if (((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) == 2) ||
              (local_ca0._0_4_ == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar7[-1].m_backend.data + lVar24),
                                  (cpp_dec_float<200U,_int,_void> *)local_d18), iVar10 < 1)) {
            puVar19 = (uint *)&local_2b8;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_b68;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_af8 = iStack_248;
            bStack_af4 = (bool)bStack_244;
            local_af0 = local_240;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_b68,
                       (cpp_dec_float<200U,_int,_void> *)local_ae8);
            puVar17 = (undefined4 *)local_9e8;
            puVar11 = (undefined4 *)local_c78;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar11 = *puVar17;
              puVar17 = puVar17 + (ulong)bVar31 * -2 + 1;
              puVar11 = puVar11 + (ulong)bVar31 * -2 + 1;
            }
            local_c78._112_4_ = iStack_978;
            local_c78[0x74] = bStack_974;
            local_c78._120_8_ = local_970;
            if ((bStack_974 == true) && (SUB84(local_970,0) != 0 || local_c78._0_4_ != 0)) {
              local_c78[0x74] = false;
            }
            puVar19 = (uint *)local_b68;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_ca8 = iStack_af8;
            bStack_ca4 = bStack_af4;
            local_ca0 = local_af0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_d18,
                       (cpp_dec_float<200U,_int,_void> *)local_c78);
            goto LAB_00596213;
          }
          puVar17 = (undefined4 *)local_448;
          puVar11 = (undefined4 *)local_c78;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            *puVar11 = *puVar17;
            puVar17 = puVar17 + (ulong)bVar31 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar31 * -2 + 1;
          }
          local_c78._112_4_ = local_448._112_4_;
          local_c78[0x74] = local_448[0x74];
          local_c78._120_8_ = local_448._120_8_;
LAB_00596005:
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_c78,
                     (cpp_dec_float<200U,_int,_void> *)local_9e8);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_b68;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
          }
          iStack_af8 = local_c78._112_4_;
          bStack_af4 = (bool)local_c78[0x74];
          local_af0 = (double)local_c78._120_8_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_b68,
                     (cpp_dec_float<200U,_int,_void> *)local_be8);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_b68;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
          }
          iStack_ca8 = iStack_af8;
          bStack_ca4 = bStack_af4;
          local_ca0 = local_af0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_d18,
                     (cpp_dec_float<200U,_int,_void> *)local_ae8);
          pnVar7 = (this->colWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
          *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_ca8;
          *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_ca4;
          *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_ca0;
          (this->colUp).data[(long)local_c98 - 2] = false;
        }
        else {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar7[-1].m_backend.data + lVar24);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
          local_648.fpclass = cpp_dec_float_finite;
          local_648.prec_elem = 0x1c;
          local_648.data._M_elems[0] = 0;
          local_648.data._M_elems[1] = 0;
          local_648.data._M_elems[2] = 0;
          local_648.data._M_elems[3] = 0;
          local_648.data._M_elems[4] = 0;
          local_648.data._M_elems[5] = 0;
          local_648.data._M_elems[6] = 0;
          local_648.data._M_elems[7] = 0;
          local_648.data._M_elems[8] = 0;
          local_648.data._M_elems[9] = 0;
          local_648.data._M_elems[10] = 0;
          local_648.data._M_elems[0xb] = 0;
          local_648.data._M_elems[0xc] = 0;
          local_648.data._M_elems[0xd] = 0;
          local_648.data._M_elems[0xe] = 0;
          local_648.data._M_elems[0xf] = 0;
          local_648.data._M_elems[0x10] = 0;
          local_648.data._M_elems[0x11] = 0;
          local_648.data._M_elems[0x12] = 0;
          local_648.data._M_elems[0x13] = 0;
          local_648.data._M_elems[0x14] = 0;
          local_648.data._M_elems[0x15] = 0;
          local_648.data._M_elems[0x16] = 0;
          local_648.data._M_elems[0x17] = 0;
          local_648.data._M_elems[0x18] = 0;
          local_648.data._M_elems[0x19] = 0;
          local_648.data._M_elems._104_5_ = 0;
          local_648.data._M_elems[0x1b]._1_3_ = 0;
          local_648.exp = 0;
          local_648.neg = false;
          if (pcVar12 == &local_648) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_648,pcVar18);
            if (local_648.data._M_elems[0] != 0 || local_648.fpclass != cpp_dec_float_finite) {
              local_648.neg = (bool)(local_648.neg ^ 1);
            }
          }
          else {
            if (pcVar18 != &local_648) {
              pcVar20 = &local_648;
              for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_648.exp = *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10);
              local_648.neg = *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc);
              local_648._120_8_ = *(undefined8 *)((long)&(pnVar7->m_backend).data + lVar24 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_648,pcVar12);
          }
          pcVar12 = &local_648;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
          }
          iStack_ca8 = local_648.exp;
          bStack_ca4 = local_648.neg;
          local_ca0 = (double)local_648._120_8_;
          if ((local_648.neg == true) &&
             (local_d18._0_4_ != 0 || local_648.fpclass != cpp_dec_float_finite)) {
            bStack_ca4 = false;
          }
          if (((local_648.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_40 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_d18,
                                  (cpp_dec_float<200U,_int,_void> *)local_b8), -1 < iVar10)) {
            pnVar7 = (base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_ca0 = 5.94158821470276e-313;
            local_d18 = (undefined1  [16])0x0;
            local_d08 = (undefined1  [16])0x0;
            local_cf8 = (undefined1  [16])0x0;
            local_ce8 = (undefined1  [16])0x0;
            local_cd8 = (undefined1  [16])0x0;
            local_cc8 = (undefined1  [16])0x0;
            local_cb8[0] = 0;
            local_cb8[1] = 0;
            stack0xfffffffffffff350 = 0;
            uStack_cab = 0;
            iStack_ca8 = 0;
            bStack_ca4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_d18,local_968);
            if (((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) != 2) &&
                (local_ca0._0_4_ != cpp_dec_float_NaN)) &&
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)
                                    ((long)&pnVar7[-1].m_backend.data + lVar24),
                                    (cpp_dec_float<200U,_int,_void> *)local_d18), 0 < iVar10)) {
              if (local_970._0_4_ != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_d18,0,(type *)0x0);
                iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_9e8,
                                    (cpp_dec_float<200U,_int,_void> *)local_d18);
                if (0 < iVar10) {
                  puVar19 = (uint *)local_338;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pcVar12->data)._M_elems[0] = *puVar19;
                    puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                  }
                  local_c78._112_4_ = local_338._112_4_;
                  local_c78[0x74] = local_338[0x74];
                  local_c78._120_8_ = local_338._120_8_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)local_c78,
                             (cpp_dec_float<200U,_int,_void> *)local_9e8);
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_b68;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar18 + (ulong)bVar31 * -8 + 4);
                  }
                  iStack_af8 = local_c78._112_4_;
                  bStack_af4 = (bool)local_c78[0x74];
                  local_af0 = (double)local_c78._120_8_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_b68,
                             (cpp_dec_float<200U,_int,_void> *)local_958);
                  goto LAB_005965fb;
                }
              }
              puVar17 = (undefined4 *)local_338;
              puVar11 = (undefined4 *)local_c78;
              for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                *puVar11 = *puVar17;
                puVar17 = puVar17 + (ulong)bVar31 * -2 + 1;
                puVar11 = puVar11 + (ulong)bVar31 * -2 + 1;
              }
              local_c78._112_4_ = local_338._112_4_;
              local_c78[0x74] = local_338[0x74];
              local_c78._120_8_ = local_338._120_8_;
              goto LAB_00596005;
            }
            puVar19 = (uint *)local_448;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            local_c78._112_4_ = local_448._112_4_;
            local_c78[0x74] = local_448[0x74];
            local_c78._120_8_ = local_448._120_8_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_c78,
                       (cpp_dec_float<200U,_int,_void> *)local_958);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_b68;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
            }
            iStack_af8 = local_c78._112_4_;
            bStack_af4 = (bool)local_c78[0x74];
            local_af0 = (double)local_c78._120_8_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_b68,
                       (cpp_dec_float<200U,_int,_void> *)local_9e8);
LAB_005965fb:
            puVar19 = (uint *)local_b68;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_ca8 = iStack_af8;
            bStack_ca4 = bStack_af4;
            local_ca0 = local_af0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_d18,
                       (cpp_dec_float<200U,_int,_void> *)local_ae8);
            pnVar7 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_ca8;
            *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_ca4;
            *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_ca0;
            (this->colUp).data[(long)local_c98 - 2] = true;
          }
          else {
            puVar19 = (uint *)local_1b8;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_b68;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_af8 = local_1b8._112_4_;
            bStack_af4 = local_1b8[0x74];
            local_af0 = local_140;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_b68,
                       (cpp_dec_float<200U,_int,_void> *)local_ae8);
            puVar17 = (undefined4 *)local_9e8;
            puVar11 = (undefined4 *)local_c78;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar11 = *puVar17;
              puVar17 = puVar17 + (ulong)bVar31 * -2 + 1;
              puVar11 = puVar11 + (ulong)bVar31 * -2 + 1;
            }
            local_c78._112_4_ = iStack_978;
            local_c78[0x74] = bStack_974;
            local_c78._120_8_ = local_970;
            if ((bStack_974 == true) && (SUB84(local_970,0) != 0 || local_c78._0_4_ != 0)) {
              local_c78[0x74] = false;
            }
            puVar19 = (uint *)local_b68;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_ca8 = iStack_af8;
            bStack_ca4 = bStack_af4;
            local_ca0 = local_af0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_d18,
                       (cpp_dec_float<200U,_int,_void> *)local_c78);
LAB_00596213:
            pnVar7 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_ca8;
            *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_ca4;
            *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_ca0;
          }
        }
        local_c98 = (double)((long)local_c98 - 1);
        lVar24 = lVar24 + -0x80;
      } while (1 < (ulong)local_c98);
    }
    dVar27 = (double)(long)(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
    if (0 < (long)dVar27) {
      local_3c8 = *(double *)(in_FS_OFFSET + -8);
      uStack_3c0 = 0;
      local_758 = -local_3c8;
      uStack_750 = 0x8000000000000000;
      do {
        dVar28 = (double)((long)dVar27 - 1);
        local_c98 = dVar27;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_9e8,1,(type *)0x0);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_958,0,(type *)0x0);
        puVar19 = (uint *)local_748;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
        }
        iStack_ca8 = local_748._112_4_;
        bStack_ca4 = local_748[0x74];
        local_ca0 = local_6d0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_d18,
                   (cpp_dec_float<200U,_int,_void> *)local_9e8);
        pcVar18 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar28].m_backend;
        local_b70 = 5.94158821470276e-313;
        local_b88[0] = 0;
        local_b88[1] = 0;
        stack0xfffffffffffff480 = 0;
        local_b98 = (undefined1  [16])0x0;
        local_ba8 = (undefined1  [16])0x0;
        local_bb8 = (undefined1  [16])0x0;
        local_bc8 = (undefined1  [16])0x0;
        local_bd8 = (undefined1  [16])0x0;
        local_be8 = (undefined1  [16])0x0;
        uStack_b7b = 0;
        iStack_b78 = 0;
        bStack_b74 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
        if ((cpp_dec_float<200U,_int,_void> *)local_be8 != pcVar18) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_be8;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
          }
          iStack_b78 = iStack_ca8;
          bStack_b74 = bStack_ca4;
          local_b70 = local_ca0;
          pcVar12 = pcVar18;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_be8,pcVar12);
        puVar19 = (uint *)local_748;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
        }
        iStack_ca8 = local_748._112_4_;
        bStack_ca4 = local_748[0x74];
        local_ca0 = local_6d0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_d18,
                   (cpp_dec_float<200U,_int,_void> *)local_9e8);
        pcVar18 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar28].m_backend;
        local_af0 = 5.94158821470276e-313;
        local_b08 = SUB1613((undefined1  [16])0x0,0);
        local_b18 = (undefined1  [16])0x0;
        local_b28 = (undefined1  [16])0x0;
        local_b38 = (undefined1  [16])0x0;
        local_b48 = (undefined1  [16])0x0;
        local_b68._16_16_ = (undefined1  [16])0x0;
        local_b68._0_16_ = (undefined1  [16])0x0;
        uStack_afb = 0;
        iStack_af8 = 0;
        bStack_af4 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
        if ((cpp_dec_float<200U,_int,_void> *)local_b68 != pcVar18) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_b68;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
          }
          iStack_af8 = iStack_ca8;
          bStack_af4 = bStack_ca4;
          local_af0 = local_ca0;
          pcVar12 = pcVar18;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_b68,pcVar12);
        puVar19 = (uint *)local_858;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
        }
        local_c78._112_4_ = iStack_7e8;
        local_c78[0x74] = bStack_7e4;
        local_c78._120_8_ = local_7e0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_c78,
                   (cpp_dec_float<200U,_int,_void> *)local_9e8);
        pIVar8 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar10 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[(long)dVar28].idx;
        local_ca0 = 5.94158821470276e-313;
        local_d18 = (undefined1  [16])0x0;
        local_d08 = (undefined1  [16])0x0;
        local_cf8 = (undefined1  [16])0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8[0] = 0;
        local_cb8[1] = 0;
        stack0xfffffffffffff350 = 0;
        uStack_cab = 0;
        iStack_ca8 = 0;
        bStack_ca4 = false;
        lVar24 = (long)pIVar8[iVar10].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        dVar27 = dVar28;
        dVar29 = (double)((long)dVar28 * 0x80);
        if (0 < lVar24) {
          uVar26 = lVar24 + 1;
          lVar24 = lVar24 * 0x84;
          local_c88 = dVar28;
          local_968 = (double)((long)dVar28 * 0x80);
          do {
            pNVar9 = pIVar8[iVar10].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)&pNVar9[-1].val.m_backend.data + lVar24);
            pcVar20 = &(local_bf8->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar9[-1].val + 1) + lVar24)].m_backend;
            local_a70 = 5.94158821470276e-313;
            local_ae8._0_16_ = (undefined1  [16])0x0;
            local_ae8._16_16_ = (undefined1  [16])0x0;
            local_ac8 = (undefined1  [16])0x0;
            local_ab8 = (undefined1  [16])0x0;
            local_aa8 = (undefined1  [16])0x0;
            local_a98 = (undefined1  [16])0x0;
            local_a88 = SUB1613((undefined1  [16])0x0,0);
            uStack_a7b = 0;
            iStack_a78 = 0;
            bStack_a74 = false;
            pcVar12 = pcVar20;
            if ((pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_ae8) &&
               (pcVar12 = pcVar18, (cpp_dec_float<200U,_int,_void> *)local_ae8 != pcVar20)) {
              pcVar18 = pcVar20;
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_ae8;
              for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                (pcVar22->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4)
                ;
              }
              iStack_a78 = pcVar20->exp;
              bStack_a74 = pcVar20->neg;
              local_a70._0_4_ = pcVar20->fpclass;
              local_a70._4_4_ = pcVar20->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_ae8,pcVar12);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_d18,
                       (cpp_dec_float<200U,_int,_void> *)local_ae8);
            uVar26 = uVar26 - 1;
            dVar27 = local_c88;
            dVar29 = local_968;
            lVar24 = lVar24 + -0x84;
          } while (1 < uVar26);
        }
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_8d8;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
        }
        local_8d8._112_4_ = iStack_ca8;
        local_8d8[0x74] = bStack_ca4;
        local_8d8._120_8_ = local_ca0;
        puVar19 = (uint *)local_c78;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ae8;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
        }
        iStack_a78 = local_c78._112_4_;
        bStack_a74 = (bool)local_c78[0x74];
        local_a70 = (double)local_c78._120_8_;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                   (cpp_dec_float<200U,_int,_void> *)local_8d8);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(((base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .right.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                  (long)dVar29);
        ::soplex::infinity::__tls_init();
        local_ca0 = 5.94158821470276e-313;
        local_d18 = ZEXT816(0);
        local_d08 = ZEXT816(0);
        local_cf8 = ZEXT816(0);
        local_ce8 = ZEXT816(0);
        local_cd8 = ZEXT816(0);
        local_cc8 = ZEXT816(0);
        local_cb8[0] = 0;
        local_cb8[1] = 0;
        stack0xfffffffffffff350 = 0;
        uStack_cab = 0;
        iStack_ca8 = 0;
        bStack_ca4 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_d18,local_3c8);
        if (((pcVar12->fpclass == cpp_dec_float_NaN) || (local_ca0._0_4_ == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar12,(cpp_dec_float<200U,_int,_void> *)local_d18), -1 < iVar10))
        {
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(((base->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .left.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                    (long)dVar29);
          ::soplex::infinity::__tls_init();
          local_ca0 = 5.94158821470276e-313;
          local_d18 = ZEXT816(0);
          local_d08 = ZEXT816(0);
          local_cf8 = ZEXT816(0);
          local_ce8 = ZEXT816(0);
          local_cd8 = ZEXT816(0);
          local_cc8 = ZEXT816(0);
          local_cb8[0] = 0;
          local_cb8[1] = 0;
          stack0xfffffffffffff350 = 0;
          uStack_cab = 0;
          iStack_ca8 = 0;
          bStack_ca4 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_d18,local_758);
          if (((pcVar12->fpclass == cpp_dec_float_NaN) || (local_ca0._0_4_ == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar12,(cpp_dec_float<200U,_int,_void> *)local_d18), iVar10 < 1))
          {
            puVar19 = (uint *)local_a68;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            local_c78._112_4_ = iStack_9f8;
            local_c78[0x74] = bStack_9f4;
            local_c78._120_8_ = local_9f0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_c78,
                       (cpp_dec_float<200U,_int,_void> *)local_958);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ae8;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_8d8;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
            }
            local_8d8._112_4_ = iStack_a78;
            local_8d8[0x74] = bStack_a74;
            local_8d8._120_8_ = local_a70;
            if ((bStack_a74 == true) && (SUB84(local_a70,0) != 0 || local_8d8._0_4_ != 0)) {
              local_8d8[0x74] = false;
            }
            puVar19 = (uint *)local_c78;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_ca8 = local_c78._112_4_;
            bStack_ca4 = (bool)local_c78[0x74];
            local_ca0 = (double)local_c78._120_8_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_d18,
                       (cpp_dec_float<200U,_int,_void> *)local_8d8);
            pnVar7 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            puVar19 = (uint *)((long)&(pnVar7->m_backend).data + (long)dVar29);
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + (long)dVar29 + 0x70U) = iStack_ca8;
            *(bool *)((long)&(pnVar7->m_backend).data + (long)dVar29 + 0x74U) = bStack_ca4;
            *(double *)((long)&(pnVar7->m_backend).data + (long)dVar29 + 0x78U) = local_ca0;
            goto LAB_005970bd;
          }
          puVar19 = (uint *)local_3b8;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_8d8;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar19;
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          }
          local_8d8._112_4_ = local_3b8._112_4_;
          local_8d8[0x74] = local_3b8[0x74];
          local_8d8._120_8_ = local_340;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_8d8,
                     (cpp_dec_float<200U,_int,_void> *)local_b68);
          local_c88 = dVar27;
          puVar19 = (uint *)local_8d8;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar19;
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          }
          local_c78._112_4_ = local_8d8._112_4_;
          local_c78[0x74] = local_8d8[0x74];
          local_c78._120_8_ = local_8d8._120_8_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_c78,
                     (cpp_dec_float<200U,_int,_void> *)local_958);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
          }
          iStack_ca8 = local_c78._112_4_;
          bStack_ca4 = (bool)local_c78[0x74];
          local_ca0 = (double)local_c78._120_8_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_d18,
                     (cpp_dec_float<200U,_int,_void> *)local_ae8);
          pnVar7 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          puVar19 = (uint *)((long)&(pnVar7->m_backend).data + (long)dVar29);
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
          *(int *)((long)&(pnVar7->m_backend).data + (long)dVar29 + 0x70U) = iStack_ca8;
          *(bool *)((long)&(pnVar7->m_backend).data + (long)dVar29 + 0x74U) = bStack_ca4;
          *(double *)((long)&(pnVar7->m_backend).data + (long)dVar29 + 0x78U) = local_ca0;
          dVar27 = local_c88;
LAB_00596f69:
          (this->rowRight).data[(long)dVar27] = false;
        }
        else {
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(((base->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .left.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                    (long)dVar29);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(((base->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .right.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                    (long)dVar29);
          local_6c8.fpclass = cpp_dec_float_finite;
          local_6c8.prec_elem = 0x1c;
          local_6c8.data._M_elems[0] = 0;
          local_6c8.data._M_elems[1] = 0;
          local_6c8.data._M_elems[2] = 0;
          local_6c8.data._M_elems[3] = 0;
          local_6c8.data._M_elems[4] = 0;
          local_6c8.data._M_elems[5] = 0;
          local_6c8.data._M_elems[6] = 0;
          local_6c8.data._M_elems[7] = 0;
          local_6c8.data._M_elems[8] = 0;
          local_6c8.data._M_elems[9] = 0;
          local_6c8.data._M_elems[10] = 0;
          local_6c8.data._M_elems[0xb] = 0;
          local_6c8.data._M_elems[0xc] = 0;
          local_6c8.data._M_elems[0xd] = 0;
          local_6c8.data._M_elems[0xe] = 0;
          local_6c8.data._M_elems[0xf] = 0;
          local_6c8.data._M_elems[0x10] = 0;
          local_6c8.data._M_elems[0x11] = 0;
          local_6c8.data._M_elems[0x12] = 0;
          local_6c8.data._M_elems[0x13] = 0;
          local_6c8.data._M_elems[0x14] = 0;
          local_6c8.data._M_elems[0x15] = 0;
          local_6c8.data._M_elems[0x16] = 0;
          local_6c8.data._M_elems[0x17] = 0;
          local_6c8.data._M_elems[0x18] = 0;
          local_6c8.data._M_elems[0x19] = 0;
          local_6c8.data._M_elems._104_5_ = 0;
          local_6c8.data._M_elems[0x1b]._1_3_ = 0;
          local_6c8.exp = 0;
          local_6c8.neg = false;
          local_968 = dVar29;
          if (&local_6c8 == pcVar12) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_6c8,pcVar18);
            if (local_6c8.data._M_elems[0] != 0 || local_6c8.fpclass != cpp_dec_float_finite) {
              local_6c8.neg = (bool)(local_6c8.neg ^ 1);
            }
          }
          else {
            if (&local_6c8 != pcVar18) {
              pcVar20 = pcVar18;
              pcVar22 = &local_6c8;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar22->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_6c8.exp = pcVar18->exp;
              local_6c8.neg = pcVar18->neg;
              local_6c8.fpclass = pcVar18->fpclass;
              local_6c8.prec_elem = pcVar18->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_6c8,pcVar12);
          }
          pcVar12 = &local_6c8;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar24 = 0x1c; dVar28 = local_968, lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
          }
          iStack_ca8 = local_6c8.exp;
          bStack_ca4 = local_6c8.neg;
          local_ca0 = (double)local_6c8._120_8_;
          if ((local_6c8.neg == true) &&
             (local_d18._0_4_ != 0 || local_6c8.fpclass != cpp_dec_float_finite)) {
            bStack_ca4 = false;
          }
          if (((local_6c8.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_40 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_d18,
                                  (cpp_dec_float<200U,_int,_void> *)local_b8), -1 < iVar10)) {
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)&(((base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .left.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                      (long)dVar28);
            ::soplex::infinity::__tls_init();
            local_ca0 = 5.94158821470276e-313;
            local_d18 = (undefined1  [16])0x0;
            local_d08 = (undefined1  [16])0x0;
            local_cf8 = (undefined1  [16])0x0;
            local_ce8 = (undefined1  [16])0x0;
            local_cd8 = (undefined1  [16])0x0;
            local_cc8 = (undefined1  [16])0x0;
            local_cb8[0] = 0;
            local_cb8[1] = 0;
            stack0xfffffffffffff350 = 0;
            uStack_cab = 0;
            iStack_ca8 = 0;
            bStack_ca4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_d18,local_758);
            if ((pcVar12->fpclass == cpp_dec_float_NaN) || (local_ca0._0_4_ == cpp_dec_float_NaN)) {
LAB_0059742e:
              puVar19 = (uint *)local_3b8;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_8d8;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar12->data)._M_elems[0] = *puVar19;
                puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_8d8._112_4_ = local_3b8._112_4_;
              local_8d8[0x74] = local_3b8[0x74];
              local_8d8._120_8_ = local_340;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_8d8,
                         (cpp_dec_float<200U,_int,_void> *)local_be8);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_8d8;
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_c78;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_c78._112_4_ = local_8d8._112_4_;
              local_c78[0x74] = local_8d8[0x74];
              local_c78._120_8_ = local_8d8._120_8_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_c78,
                         (cpp_dec_float<200U,_int,_void> *)local_958);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_d18;
              for (lVar24 = 0x1c; pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_ae8, lVar24 != 0
                  ; lVar24 = lVar24 + -1) {
                (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4)
                ;
              }
            }
            else {
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar12,(cpp_dec_float<200U,_int,_void> *)local_d18);
              if (iVar10 < 1) goto LAB_0059742e;
              if (local_a70._0_4_ == cpp_dec_float_NaN) {
LAB_0059769d:
                puVar19 = (uint *)local_4c8;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_8d8;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                }
                local_8d8._112_4_ = local_4c8._112_4_;
                local_8d8[0x74] = local_4c8[0x74];
                local_8d8._120_8_ = local_450;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_8d8,
                           (cpp_dec_float<200U,_int,_void> *)local_ae8);
                puVar19 = (uint *)local_8d8;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                }
                local_c78._112_4_ = local_8d8._112_4_;
                local_c78[0x74] = local_8d8[0x74];
                local_c78._120_8_ = local_8d8._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_c78,
                           (cpp_dec_float<200U,_int,_void> *)local_b68);
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_d18;
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar31 * -8 + 4);
                }
                iStack_ca8 = local_c78._112_4_;
                bStack_ca4 = (bool)local_c78[0x74];
                local_ca0 = (double)local_c78._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_d18,
                           (cpp_dec_float<200U,_int,_void> *)local_958);
                pnVar7 = (this->rowWeight).data.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
                puVar19 = (uint *)((long)&(pnVar7->m_backend).data + (long)dVar28);
                for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                  *puVar19 = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                }
                *(int *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x70U) = iStack_ca8;
                *(bool *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x74U) = bStack_ca4;
                *(double *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x78U) = local_ca0;
                goto LAB_00596f69;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_d18,0,(type *)0x0);
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_ae8,
                                  (cpp_dec_float<200U,_int,_void> *)local_d18);
              if (iVar10 < 1) goto LAB_0059769d;
              puVar19 = (uint *)local_4c8;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_8d8;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar12->data)._M_elems[0] = *puVar19;
                puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_8d8._112_4_ = local_4c8._112_4_;
              local_8d8[0x74] = local_4c8[0x74];
              local_8d8._120_8_ = local_450;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_8d8,
                         (cpp_dec_float<200U,_int,_void> *)local_ae8);
              puVar19 = (uint *)local_8d8;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar12->data)._M_elems[0] = *puVar19;
                puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_c78._112_4_ = local_8d8._112_4_;
              local_c78[0x74] = local_8d8[0x74];
              local_c78._120_8_ = local_8d8._120_8_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_c78,
                         (cpp_dec_float<200U,_int,_void> *)local_be8);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_d18;
              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4)
                ;
              }
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_958;
            }
            iStack_ca8 = local_c78._112_4_;
            bStack_ca4 = (bool)local_c78[0x74];
            local_ca0 = (double)local_c78._120_8_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_d18,pcVar20);
            pnVar7 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            puVar19 = (uint *)((long)&(pnVar7->m_backend).data + (long)dVar28);
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x70U) = iStack_ca8;
            *(bool *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x74U) = bStack_ca4;
            *(double *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x78U) = local_ca0;
            (this->rowRight).data[(long)dVar27] = true;
          }
          else {
            puVar19 = (uint *)&local_238;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            local_c78._112_4_ = iStack_1c8;
            local_c78[0x74] = bStack_1c4;
            local_c78._120_8_ = local_1c0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_c78,
                       (cpp_dec_float<200U,_int,_void> *)local_958);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ae8;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_8d8;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
            }
            local_8d8._112_4_ = iStack_a78;
            local_8d8[0x74] = bStack_a74;
            local_8d8._120_8_ = local_a70;
            if ((bStack_a74 == true) && (SUB84(local_a70,0) != 0 || local_8d8._0_4_ != 0)) {
              local_8d8[0x74] = false;
            }
            puVar19 = (uint *)local_c78;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_ca8 = local_c78._112_4_;
            bStack_ca4 = (bool)local_c78[0x74];
            local_ca0 = (double)local_c78._120_8_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_d18,
                       (cpp_dec_float<200U,_int,_void> *)local_8d8);
            pnVar7 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            puVar19 = (uint *)((long)&(pnVar7->m_backend).data + (long)dVar28);
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x70U) = iStack_ca8;
            *(bool *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x74U) = bStack_ca4;
            *(double *)((long)&(pnVar7->m_backend).data + (long)dVar28 + 0x78U) = local_ca0;
          }
        }
LAB_005970bd:
      } while (1 < (long)local_c98);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_858,pVVar14);
    local_a70 = 5.94158821470276e-313;
    local_ae8._0_16_ = (undefined1  [16])0x0;
    local_ae8._16_16_ = (undefined1  [16])0x0;
    local_ac8 = (undefined1  [16])0x0;
    local_ab8 = (undefined1  [16])0x0;
    local_aa8 = (undefined1  [16])0x0;
    local_a98 = (undefined1  [16])0x0;
    local_a88 = SUB1613((undefined1  [16])0x0,0);
    uStack_a7b = 0;
    iStack_a78 = 0;
    bStack_a74 = false;
    local_ca0 = 5.94158821470276e-313;
    local_d18 = (undefined1  [16])0x0;
    local_d08 = (undefined1  [16])0x0;
    local_cf8 = (undefined1  [16])0x0;
    local_ce8 = (undefined1  [16])0x0;
    local_cd8 = (undefined1  [16])0x0;
    local_cc8 = (undefined1  [16])0x0;
    local_cb8[0] = 0;
    local_cb8[1] = 0;
    stack0xfffffffffffff350 = 0;
    uStack_cab = 0;
    iStack_ca8 = 0;
    bStack_ca4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_d18,0.001);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_ae8,
               (cpp_dec_float<200U,_int,_void> *)local_d18,
               (cpp_dec_float<200U,_int,_void> *)local_858);
    local_7e0 = 5.94158821470276e-313;
    local_858 = ZEXT816(0);
    local_848 = ZEXT816(0);
    local_838 = ZEXT816(0);
    local_828 = ZEXT816(0);
    local_818 = ZEXT816(0);
    local_808 = ZEXT816(0);
    local_7f8[0] = 0;
    local_7f8[1] = 0;
    stack0xfffffffffffff810 = 0;
    uStack_7eb = 0;
    iStack_7e8 = 0;
    bStack_7e4 = false;
    local_ca0 = 5.94158821470276e-313;
    local_d18 = ZEXT816(0);
    local_d08 = ZEXT816(0);
    local_cf8 = ZEXT816(0);
    local_ce8 = ZEXT816(0);
    local_cd8 = ZEXT816(0);
    local_cc8 = ZEXT816(0);
    local_cb8[0] = 0;
    local_cb8[1] = 0;
    stack0xfffffffffffff350 = 0;
    uStack_cab = 0;
    iStack_ca8 = 0;
    bStack_ca4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_d18,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_858,
               (cpp_dec_float<200U,_int,_void> *)local_d18,&local_7d8);
    local_6d0 = 5.94158821470276e-313;
    local_748._0_4_ = 0;
    local_748._4_4_ = 0;
    local_748._8_4_ = 0;
    local_748._12_4_ = 0;
    local_748._16_4_ = 0;
    local_748._20_4_ = 0;
    local_748._24_4_ = 0;
    local_748._28_4_ = 0;
    local_748._32_4_ = 0;
    local_748._36_4_ = 0;
    local_748._40_4_ = 0;
    local_748._44_4_ = 0;
    local_748._48_4_ = 0;
    local_748._52_4_ = 0;
    local_748._56_4_ = 0;
    local_748._60_4_ = 0;
    local_748._64_4_ = 0;
    local_748._68_4_ = 0;
    local_748._72_4_ = 0;
    local_748._76_4_ = 0;
    local_748._80_4_ = 0;
    local_748._84_4_ = 0;
    local_748._88_4_ = 0;
    local_748._92_4_ = 0;
    local_748._96_4_ = 0;
    local_748._100_4_ = 0;
    local_748._104_5_ = 0;
    local_748._109_3_ = 0;
    local_748._112_4_ = 0;
    local_748[0x74] = false;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_d18,
               (long)(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_748,
               (cpp_dec_float<200U,_int,_void> *)local_ae8,
               (cpp_dec_float<200U,_int,_void> *)local_d18);
    local_c0 = 5.94158821470276e-313;
    local_138._0_4_ = 0;
    local_138._4_4_ = 0;
    local_138._8_4_ = 0;
    local_138._12_4_ = 0;
    local_138._16_4_ = 0;
    local_138._20_4_ = 0;
    local_138._24_4_ = 0;
    local_138._28_4_ = 0;
    local_138._32_4_ = 0;
    local_138._36_4_ = 0;
    local_138._40_4_ = 0;
    local_138._44_4_ = 0;
    local_138._48_4_ = 0;
    local_138._52_4_ = 0;
    local_138._56_4_ = 0;
    local_138._60_4_ = 0;
    local_138._64_4_ = 0;
    local_138._68_4_ = 0;
    local_138._72_4_ = 0;
    local_138._76_4_ = 0;
    local_138._80_4_ = 0;
    local_138._84_4_ = 0;
    local_138._88_4_ = 0;
    local_138._92_4_ = 0;
    local_138._96_4_ = 0;
    local_138._100_4_ = 0;
    local_138._104_5_ = 0;
    local_138._109_3_ = 0;
    local_138._112_4_ = 0;
    local_138[0x74] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_138,100000.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_1b8,0,(type *)0x0);
    local_1c0 = 5.94158821470276e-313;
    local_238 = 0;
    uStack_230 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1cb = 0;
    iStack_1c8 = 0;
    bStack_1c4 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_238,10.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_338,0,(type *)0x0);
    local_450 = 5.94158821470276e-313;
    local_4c8._0_4_ = 0;
    local_4c8._4_4_ = 0;
    local_4c8._8_4_ = 0;
    local_4c8._12_4_ = 0;
    local_4c8._16_4_ = 0;
    local_4c8._20_4_ = 0;
    local_4c8._24_4_ = 0;
    local_4c8._28_4_ = 0;
    local_4c8._32_4_ = 0;
    local_4c8._36_4_ = 0;
    local_4c8._40_4_ = 0;
    local_4c8._44_4_ = 0;
    local_4c8._48_4_ = 0;
    local_4c8._52_4_ = 0;
    local_4c8._56_4_ = 0;
    local_4c8._60_4_ = 0;
    local_4c8._64_4_ = 0;
    local_4c8._68_4_ = 0;
    local_4c8._72_4_ = 0;
    local_4c8._76_4_ = 0;
    local_4c8._80_4_ = 0;
    local_4c8._84_4_ = 0;
    local_4c8._88_4_ = 0;
    local_4c8._92_4_ = 0;
    local_4c8._96_4_ = 0;
    local_4c8._100_4_ = 0;
    local_4c8._104_5_ = 0;
    local_4c8._109_3_ = 0;
    local_4c8._112_4_ = 0;
    local_4c8[0x74] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_4c8,10.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_448,0,(type *)0x0);
    local_340 = 5.94158821470276e-313;
    local_3b8._0_4_ = 0;
    local_3b8._4_4_ = 0;
    local_3b8._8_4_ = 0;
    local_3b8._12_4_ = 0;
    local_3b8._16_4_ = 0;
    local_3b8._20_4_ = 0;
    local_3b8._24_4_ = 0;
    local_3b8._28_4_ = 0;
    local_3b8._32_4_ = 0;
    local_3b8._36_4_ = 0;
    local_3b8._40_4_ = 0;
    local_3b8._44_4_ = 0;
    local_3b8._48_4_ = 0;
    local_3b8._52_4_ = 0;
    local_3b8._56_4_ = 0;
    local_3b8._60_4_ = 0;
    local_3b8._64_4_ = 0;
    local_3b8._68_4_ = 0;
    local_3b8._72_4_ = 0;
    local_3b8._76_4_ = 0;
    local_3b8._80_4_ = 0;
    local_3b8._84_4_ = 0;
    local_3b8._88_4_ = 0;
    local_3b8._92_4_ = 0;
    local_3b8._96_4_ = 0;
    local_3b8._100_4_ = 0;
    local_3b8._104_5_ = 0;
    local_3b8._109_3_ = 0;
    local_3b8._112_4_ = 0;
    local_3b8[0x74] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_3b8,-10000.0);
    local_240 = 5.94158821470276e-313;
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_24b = 0;
    iStack_248 = 0;
    bStack_244 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2b8,-100000.0);
    lVar24 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar24) {
      local_c98 = *(double *)(in_FS_OFFSET + -8);
      uStack_c90 = 0;
      local_c88 = -local_c98;
      uStack_c80 = 0x8000000000000000;
      local_bf8 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(lVar24 + 1);
      lVar24 = lVar24 << 7;
      do {
        local_9f0 = 5.94158821470276e-313;
        local_a68 = (undefined1  [16])0x0;
        local_a58 = (undefined1  [16])0x0;
        local_a48 = (undefined1  [16])0x0;
        local_a38 = (undefined1  [16])0x0;
        local_a28 = (undefined1  [16])0x0;
        local_a18 = (undefined1  [16])0x0;
        local_a08[0] = 0;
        local_a08[1] = 0;
        stack0xfffffffffffff600 = 0;
        uStack_9fb = 0;
        iStack_9f8 = 0;
        bStack_9f4 = false;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_d18,
                   (long)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[(long)local_bf8 - 2].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused + -1,(type *)0x0);
        puVar19 = (uint *)local_748;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_a68;
        for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
        }
        iStack_9f8 = local_748._112_4_;
        bStack_9f4 = local_748[0x74];
        local_9f0 = local_6d0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_a68,
                   (cpp_dec_float<200U,_int,_void> *)local_d18);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
        local_ca0 = 5.94158821470276e-313;
        local_d18 = (undefined1  [16])0x0;
        local_d08 = (undefined1  [16])0x0;
        local_cf8 = (undefined1  [16])0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8[0] = 0;
        local_cb8[1] = 0;
        stack0xfffffffffffff350 = 0;
        uStack_cab = 0;
        iStack_ca8 = 0;
        bStack_ca4 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_ae8;
        if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_d18) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
          }
          iStack_ca8 = iStack_a78;
          bStack_ca4 = bStack_a74;
          local_ca0 = local_a70;
          pcVar12 = pcVar18;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_d18,pcVar12);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
        local_970 = 5.94158821470276e-313;
        local_9e8._0_16_ = (undefined1  [16])0x0;
        local_9e8._16_16_ = (undefined1  [16])0x0;
        local_9c8 = (undefined1  [16])0x0;
        local_9b8 = (undefined1  [16])0x0;
        local_9a8 = (undefined1  [16])0x0;
        local_998 = (undefined1  [16])0x0;
        local_988 = SUB1613((undefined1  [16])0x0,0);
        uStack_97b = 0;
        iStack_978 = 0;
        bStack_974 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_858;
        if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_9e8) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
          }
          iStack_978 = iStack_7e8;
          bStack_974 = bStack_7e4;
          local_970 = local_7e0;
          pcVar12 = pcVar18;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_9e8,pcVar12);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
        local_8e0 = 5.94158821470276e-313;
        local_958._0_16_ = (undefined1  [16])0x0;
        local_958._16_16_ = (undefined1  [16])0x0;
        local_938 = (undefined1  [16])0x0;
        local_928 = (undefined1  [16])0x0;
        local_918 = (undefined1  [16])0x0;
        local_908 = (undefined1  [16])0x0;
        local_8f8 = SUB1613((undefined1  [16])0x0,0);
        uStack_8eb = 0;
        iStack_8e8 = 0;
        bStack_8e4 = false;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_858;
        if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_958) {
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_958;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
          }
          iStack_8e8 = iStack_7e8;
          bStack_8e4 = bStack_7e4;
          local_8e0 = local_7e0;
          pcVar12 = pcVar18;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_958,pcVar12);
        pnVar7 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_b70 = 5.94158821470276e-313;
        local_be8 = (undefined1  [16])0x0;
        local_bd8 = (undefined1  [16])0x0;
        local_bc8 = (undefined1  [16])0x0;
        local_bb8 = (undefined1  [16])0x0;
        local_ba8 = (undefined1  [16])0x0;
        local_b98 = (undefined1  [16])0x0;
        local_b88[0] = 0;
        local_b88[1] = 0;
        stack0xfffffffffffff480 = 0;
        uStack_b7b = 0;
        iStack_b78 = 0;
        bStack_b74 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_be8,local_c98);
        if (((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) == 2) ||
            (local_b70._0_4_ == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)&pnVar7[-1].m_backend.data + lVar24),
                                (cpp_dec_float<200U,_int,_void> *)local_be8), -1 < iVar10)) {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_b70 = 5.94158821470276e-313;
          local_be8 = ZEXT816(0);
          local_bd8 = ZEXT816(0);
          local_bc8 = ZEXT816(0);
          local_bb8 = ZEXT816(0);
          local_ba8 = ZEXT816(0);
          local_b98 = ZEXT816(0);
          local_b88[0] = 0;
          local_b88[1] = 0;
          stack0xfffffffffffff480 = 0;
          uStack_b7b = 0;
          iStack_b78 = 0;
          bStack_b74 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_be8,local_c88);
          if (((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) == 2) ||
              (local_b70._0_4_ == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar7[-1].m_backend.data + lVar24),
                                  (cpp_dec_float<200U,_int,_void> *)local_be8), iVar10 < 1)) {
            puVar19 = (uint *)local_3b8;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_b68;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_af8 = local_3b8._112_4_;
            bStack_af4 = local_3b8[0x74];
            local_af0 = local_340;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_b68,
                       (cpp_dec_float<200U,_int,_void> *)local_a68);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            puVar19 = (uint *)local_c78;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            local_c78._112_4_ = iStack_ca8;
            local_c78[0x74] = bStack_ca4;
            local_c78._120_8_ = local_ca0;
            if ((bStack_ca4 == true) && (SUB84(local_ca0,0) != 0 || local_c78._0_4_ != 0)) {
              local_c78[0x74] = false;
            }
            puVar19 = (uint *)local_b68;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_be8;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_b78 = iStack_af8;
            bStack_b74 = bStack_af4;
            local_b70 = local_af0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_be8,
                       (cpp_dec_float<200U,_int,_void> *)local_c78);
            goto LAB_005946d0;
          }
          puVar19 = (uint *)local_4c8;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar19;
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          }
          local_c78._112_4_ = local_4c8._112_4_;
          local_c78[0x74] = local_4c8[0x74];
          local_c78._120_8_ = local_450;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_c78,
                     (cpp_dec_float<200U,_int,_void> *)local_958);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_b68;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
          }
          iStack_af8 = local_c78._112_4_;
          bStack_af4 = (bool)local_c78[0x74];
          local_af0 = (double)local_c78._120_8_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_b68,
                     (cpp_dec_float<200U,_int,_void> *)local_a68);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_b68;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_be8;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
          }
          iStack_b78 = iStack_af8;
          bStack_b74 = bStack_af4;
          local_b70 = local_af0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_be8,
                     (cpp_dec_float<200U,_int,_void> *)local_d18);
          pnVar7 = (this->colWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_be8;
          puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
          *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_b78;
          *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_b74;
          *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_b70;
          (this->colUp).data[(long)local_bf8 - 2] = false;
          pVVar14 = local_bf8;
        }
        else {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar7[-1].m_backend.data + lVar24);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
          local_548.fpclass = cpp_dec_float_finite;
          local_548.prec_elem = 0x1c;
          local_548.data._M_elems[0] = 0;
          local_548.data._M_elems[1] = 0;
          local_548.data._M_elems[2] = 0;
          local_548.data._M_elems[3] = 0;
          local_548.data._M_elems[4] = 0;
          local_548.data._M_elems[5] = 0;
          local_548.data._M_elems[6] = 0;
          local_548.data._M_elems[7] = 0;
          local_548.data._M_elems[8] = 0;
          local_548.data._M_elems[9] = 0;
          local_548.data._M_elems[10] = 0;
          local_548.data._M_elems[0xb] = 0;
          local_548.data._M_elems[0xc] = 0;
          local_548.data._M_elems[0xd] = 0;
          local_548.data._M_elems[0xe] = 0;
          local_548.data._M_elems[0xf] = 0;
          local_548.data._M_elems[0x10] = 0;
          local_548.data._M_elems[0x11] = 0;
          local_548.data._M_elems[0x12] = 0;
          local_548.data._M_elems[0x13] = 0;
          local_548.data._M_elems[0x14] = 0;
          local_548.data._M_elems[0x15] = 0;
          local_548.data._M_elems[0x16] = 0;
          local_548.data._M_elems[0x17] = 0;
          local_548.data._M_elems[0x18] = 0;
          local_548.data._M_elems[0x19] = 0;
          local_548.data._M_elems._104_5_ = 0;
          local_548.data._M_elems[0x1b]._1_3_ = 0;
          local_548.exp = 0;
          local_548.neg = false;
          if (pcVar12 == &local_548) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_548,pcVar18);
            if (local_548.data._M_elems[0] != 0 || local_548.fpclass != cpp_dec_float_finite) {
              local_548.neg = (bool)(local_548.neg ^ 1);
            }
          }
          else {
            if (pcVar18 != &local_548) {
              pcVar20 = &local_548;
              for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_548.exp = *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10);
              local_548.neg = *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc);
              local_548._120_8_ = *(undefined8 *)((long)&(pnVar7->m_backend).data + lVar24 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_548,pcVar12);
          }
          pcVar12 = &local_548;
          puVar19 = (uint *)local_be8;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
          iStack_b78 = local_548.exp;
          bStack_b74 = local_548.neg;
          local_b70 = (double)local_548._120_8_;
          if ((local_548.neg == true) &&
             (local_be8._0_4_ != 0 || local_548.fpclass != cpp_dec_float_finite)) {
            bStack_b74 = false;
          }
          if (((local_548.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_40 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_be8,
                                  (cpp_dec_float<200U,_int,_void> *)local_b8), -1 < iVar10)) {
            pnVar7 = (base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_b70 = 5.94158821470276e-313;
            local_be8 = (undefined1  [16])0x0;
            local_bd8 = (undefined1  [16])0x0;
            local_bc8 = (undefined1  [16])0x0;
            local_bb8 = (undefined1  [16])0x0;
            local_ba8 = (undefined1  [16])0x0;
            local_b98 = (undefined1  [16])0x0;
            local_b88[0] = 0;
            local_b88[1] = 0;
            stack0xfffffffffffff480 = 0;
            uStack_b7b = 0;
            iStack_b78 = 0;
            bStack_b74 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_be8,local_c88);
            if ((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) != 2) &&
               (local_b70._0_4_ != cpp_dec_float_NaN)) {
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar7[-1].m_backend.data + lVar24),
                                  (cpp_dec_float<200U,_int,_void> *)local_be8);
              if (0 < iVar10) {
                puVar19 = (uint *)&local_238;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                }
                local_c78._112_4_ = iStack_1c8;
                local_c78[0x74] = bStack_1c4;
                local_c78._120_8_ = local_1c0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_c78,
                           (cpp_dec_float<200U,_int,_void> *)local_958);
                puVar19 = (uint *)local_c78;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_b68;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                }
                iStack_af8 = local_c78._112_4_;
                bStack_af4 = (bool)local_c78[0x74];
                local_af0 = (double)local_c78._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_b68,
                           (cpp_dec_float<200U,_int,_void> *)local_9e8);
                puVar19 = (uint *)local_b68;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_be8;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                }
                iStack_b78 = iStack_af8;
                bStack_b74 = bStack_af4;
                local_b70 = local_af0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_be8,
                           (cpp_dec_float<200U,_int,_void> *)local_a68);
                pnVar7 = (this->colWeight).data.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_be8;
                puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  *puVar19 = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                }
                *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_b78;
                *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_b74;
                *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_b70;
                if (bStack_8e4 == true) {
                  bStack_8e4 = local_958._0_4_ == 0 && local_8e0._0_4_ == cpp_dec_float_finite;
                }
                if (bStack_974 == true) {
                  bStack_974 = local_9e8._0_4_ == 0 && local_970._0_4_ == cpp_dec_float_finite;
                }
                if ((local_8e0._0_4_ == cpp_dec_float_NaN || local_970._0_4_ == cpp_dec_float_NaN)
                   || (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                compare((cpp_dec_float<200U,_int,_void> *)local_9e8,
                                        (cpp_dec_float<200U,_int,_void> *)local_958),
                      pVVar14 = local_bf8, -1 < iVar10)) {
                  pVVar14 = local_bf8;
                  (this->colUp).data[(long)local_bf8 - 2] = false;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)&(this->colWeight).data.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                             lVar24),(cpp_dec_float<200U,_int,_void> *)local_d18);
                }
                else {
                  (this->colUp).data[(long)local_bf8 - 2] = true;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)&(this->colWeight).data.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                             lVar24),(cpp_dec_float<200U,_int,_void> *)local_d18);
                }
                goto LAB_00594715;
              }
            }
            puVar19 = (uint *)local_4c8;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            local_c78._112_4_ = local_4c8._112_4_;
            local_c78[0x74] = local_4c8[0x74];
            local_c78._120_8_ = local_450;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_c78,
                       (cpp_dec_float<200U,_int,_void> *)local_9e8);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_c78;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_b68;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
            }
            iStack_af8 = local_c78._112_4_;
            bStack_af4 = (bool)local_c78[0x74];
            local_af0 = (double)local_c78._120_8_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_b68,
                       (cpp_dec_float<200U,_int,_void> *)local_d18);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_b68;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_be8;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
            }
            iStack_b78 = iStack_af8;
            bStack_b74 = bStack_af4;
            local_b70 = local_af0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_be8,
                       (cpp_dec_float<200U,_int,_void> *)local_a68);
            pnVar7 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_be8;
            puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_b78;
            *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_b74;
            *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_b70;
            (this->colUp).data[(long)local_bf8 - 2] = true;
            pVVar14 = local_bf8;
          }
          else {
            puVar19 = (uint *)local_138;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_b68;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_af8 = local_138._112_4_;
            bStack_af4 = local_138[0x74];
            local_af0 = local_c0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_b68,
                       (cpp_dec_float<200U,_int,_void> *)local_a68);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            puVar19 = (uint *)local_c78;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            local_c78._112_4_ = iStack_ca8;
            local_c78[0x74] = bStack_ca4;
            local_c78._120_8_ = local_ca0;
            if ((bStack_ca4 == true) && (SUB84(local_ca0,0) != 0 || local_c78._0_4_ != 0)) {
              local_c78[0x74] = false;
            }
            puVar19 = (uint *)local_b68;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_be8;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_b78 = iStack_af8;
            bStack_b74 = bStack_af4;
            local_b70 = local_af0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_be8,
                       (cpp_dec_float<200U,_int,_void> *)local_c78);
LAB_005946d0:
            pnVar7 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar17 = (undefined4 *)local_be8;
            puVar11 = (undefined4 *)((long)&pnVar7[-1].m_backend.data + lVar24);
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar11 = *puVar17;
              puVar17 = puVar17 + (ulong)bVar31 * -2 + 1;
              puVar11 = puVar11 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_b78;
            *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_b74;
            *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_b70;
            pVVar14 = local_bf8;
          }
        }
LAB_00594715:
        local_bf8 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pVVar14 - 1);
        lVar24 = lVar24 + -0x80;
      } while (1 < local_bf8);
    }
    lVar24 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar24) {
      local_bf8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)(in_FS_OFFSET + -8);
      uStack_bf0 = 0;
      local_c98 = -(double)local_bf8;
      uStack_c90 = 0x8000000000000000;
      uVar26 = lVar24 + 1;
      lVar24 = lVar24 << 7;
      do {
        pnVar7 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_ca0 = 5.94158821470276e-313;
        local_d18 = (undefined1  [16])0x0;
        local_d08 = (undefined1  [16])0x0;
        local_cf8 = (undefined1  [16])0x0;
        local_ce8 = (undefined1  [16])0x0;
        local_cd8 = (undefined1  [16])0x0;
        local_cc8 = (undefined1  [16])0x0;
        local_cb8[0] = 0;
        local_cb8[1] = 0;
        stack0xfffffffffffff350 = 0;
        uStack_cab = 0;
        iStack_ca8 = 0;
        bStack_ca4 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_d18,(double)local_bf8);
        if (((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) == 2) ||
            (local_ca0._0_4_ == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)
                                ((long)&pnVar7[-1].m_backend.data + lVar24),
                                (cpp_dec_float<200U,_int,_void> *)local_d18), -1 < iVar10)) {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_ca0 = 5.94158821470276e-313;
          local_d18 = ZEXT816(0);
          local_d08 = ZEXT816(0);
          local_cf8 = ZEXT816(0);
          local_ce8 = ZEXT816(0);
          local_cd8 = ZEXT816(0);
          local_cc8 = ZEXT816(0);
          local_cb8[0] = 0;
          local_cb8[1] = 0;
          stack0xfffffffffffff350 = 0;
          uStack_cab = 0;
          iStack_ca8 = 0;
          bStack_ca4 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_d18,local_c98);
          if (((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) == 2) ||
              (local_ca0._0_4_ == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar7[-1].m_backend.data + lVar24),
                                  (cpp_dec_float<200U,_int,_void> *)local_d18), iVar10 < 1)) {
            pnVar7 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar11 = (undefined4 *)((long)&pnVar7[-1].m_backend.data + lVar24);
            puVar16 = &local_2b8;
            puVar17 = puVar11;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar17 = *(undefined4 *)puVar16;
              puVar16 = (undefined8 *)((long)puVar16 + (ulong)bVar31 * -8 + 4);
              puVar17 = puVar17 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_248;
            *(byte *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_244;
            dVar27 = local_240;
            goto LAB_005950eb;
          }
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .left.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
          local_9f0 = 5.94158821470276e-313;
          local_a68 = (undefined1  [16])0x0;
          local_a58 = (undefined1  [16])0x0;
          local_a48 = (undefined1  [16])0x0;
          local_a38 = (undefined1  [16])0x0;
          local_a28 = (undefined1  [16])0x0;
          local_a18 = (undefined1  [16])0x0;
          local_a08[0] = 0;
          local_a08[1] = 0;
          stack0xfffffffffffff600 = 0;
          uStack_9fb = 0;
          iStack_9f8 = 0;
          bStack_9f4 = false;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_858;
          if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_a68) {
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_a68;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4);
            }
            iStack_9f8 = iStack_7e8;
            bStack_9f4 = bStack_7e4;
            local_9f0 = local_7e0;
            pcVar12 = pcVar18;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_a68,pcVar12);
          puVar19 = (uint *)local_448;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar19;
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
          }
          iStack_ca8 = local_448._112_4_;
          bStack_ca4 = local_448[0x74];
          local_ca0 = (double)local_448._120_8_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_d18,
                     (cpp_dec_float<200U,_int,_void> *)local_a68);
          pnVar7 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            *puVar19 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
          }
          *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_ca8;
          *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_ca4;
          *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_ca0;
          (this->rowRight).data[uVar26 - 2] = false;
        }
        else {
          pnVar7 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar7[-1].m_backend.data + lVar24);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .right.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24);
          local_550 = 5.94158821470276e-313;
          local_5c8._0_4_ = 0;
          local_5c8._4_4_ = 0;
          local_5c8._8_4_ = 0;
          local_5c8._12_4_ = 0;
          local_5c8._16_4_ = 0;
          local_5c8._20_4_ = 0;
          local_5c8._24_4_ = 0;
          local_5c8._28_4_ = 0;
          local_5c8._32_4_ = 0;
          local_5c8._36_4_ = 0;
          local_5c8._40_4_ = 0;
          local_5c8._44_4_ = 0;
          local_5c8._48_4_ = 0;
          local_5c8._52_4_ = 0;
          local_5c8._56_4_ = 0;
          local_5c8._60_4_ = 0;
          local_5c8._64_4_ = 0;
          local_5c8._68_4_ = 0;
          local_5c8._72_4_ = 0;
          local_5c8._76_4_ = 0;
          local_5c8._80_4_ = 0;
          local_5c8._84_4_ = 0;
          local_5c8._88_4_ = 0;
          local_5c8._92_4_ = 0;
          local_5c8._96_4_ = 0;
          local_5c8._100_4_ = 0;
          local_5c8._104_5_ = 0;
          local_5c8._109_3_ = 0;
          local_5c8._112_4_ = 0;
          local_5c8[0x74] = false;
          if (pcVar12 == (cpp_dec_float<200U,_int,_void> *)local_5c8) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_5c8,pcVar18);
            if (local_5c8._0_4_ != 0 || local_550._0_4_ != cpp_dec_float_finite) {
              local_5c8[0x74] = local_5c8[0x74] ^ 1;
            }
          }
          else {
            if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_5c8) {
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_5c8;
              for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_5c8._112_4_ = *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10);
              local_5c8[0x74] = *(byte *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc);
              local_550 = *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_5c8,pcVar12);
          }
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5c8;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_d18;
          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar31 * -8 + 4);
          }
          iStack_ca8 = local_5c8._112_4_;
          bStack_ca4 = (bool)local_5c8[0x74];
          local_ca0 = local_550;
          if (((bool)local_5c8[0x74] == true) && (local_d18._0_4_ != 0 || SUB84(local_550,0) != 0))
          {
            bStack_ca4 = false;
          }
          if (((SUB84(local_550,0) == 2) || ((fpclass_type)local_40 == cpp_dec_float_NaN)) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_d18,
                                  (cpp_dec_float<200U,_int,_void> *)local_b8), -1 < iVar10)) {
            pnVar7 = (base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_ca0 = 5.94158821470276e-313;
            local_d18 = (undefined1  [16])0x0;
            local_d08 = (undefined1  [16])0x0;
            local_cf8 = (undefined1  [16])0x0;
            local_ce8 = (undefined1  [16])0x0;
            local_cd8 = (undefined1  [16])0x0;
            local_cc8 = (undefined1  [16])0x0;
            local_cb8[0] = 0;
            local_cb8[1] = 0;
            stack0xfffffffffffff350 = 0;
            uStack_cab = 0;
            iStack_ca8 = 0;
            bStack_ca4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_d18,local_c98);
            if ((*(int *)((long)&(pnVar7->m_backend).data + lVar24 + -8) != 2) &&
               (local_ca0._0_4_ != cpp_dec_float_NaN)) {
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)&pnVar7[-1].m_backend.data + lVar24),
                                  (cpp_dec_float<200U,_int,_void> *)local_d18);
              if (0 < iVar10) {
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)&(base->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .right.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                          lVar24);
                local_ca0 = 5.94158821470276e-313;
                local_d18 = (undefined1  [16])0x0;
                local_d08 = (undefined1  [16])0x0;
                local_cf8 = (undefined1  [16])0x0;
                local_ce8 = (undefined1  [16])0x0;
                local_cd8 = (undefined1  [16])0x0;
                local_cc8 = (undefined1  [16])0x0;
                local_cb8[0] = 0;
                local_cb8[1] = 0;
                stack0xfffffffffffff350 = 0;
                uStack_cab = 0;
                iStack_ca8 = 0;
                bStack_ca4 = false;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_858;
                if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_d18) {
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_d18;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                    pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar20 + (ulong)bVar31 * -8 + 4);
                  }
                  iStack_ca8 = iStack_7e8;
                  bStack_ca4 = bStack_7e4;
                  local_ca0 = local_7e0;
                  pcVar12 = pcVar18;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          ((cpp_dec_float<200U,_int,_void> *)local_d18,pcVar12);
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)&(base->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .left.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                          lVar24);
                local_9f0 = 5.94158821470276e-313;
                local_a68 = (undefined1  [16])0x0;
                local_a58 = (undefined1  [16])0x0;
                local_a48 = (undefined1  [16])0x0;
                local_a38 = (undefined1  [16])0x0;
                local_a28 = (undefined1  [16])0x0;
                local_a18 = (undefined1  [16])0x0;
                local_a08[0] = 0;
                local_a08[1] = 0;
                stack0xfffffffffffff600 = 0;
                uStack_9fb = 0;
                iStack_9f8 = 0;
                bStack_9f4 = false;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_858;
                if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_a68) {
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_a68;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                    pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar20 + (ulong)bVar31 * -8 + 4);
                  }
                  iStack_9f8 = iStack_7e8;
                  bStack_9f4 = bStack_7e4;
                  local_9f0 = local_7e0;
                  pcVar12 = pcVar18;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          ((cpp_dec_float<200U,_int,_void> *)local_a68,pcVar12);
                puVar19 = (uint *)local_338;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_958;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pcVar12->data)._M_elems[0] = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                }
                iStack_8e8 = local_338._112_4_;
                bStack_8e4 = local_338[0x74];
                local_8e0 = (double)local_338._120_8_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_958,
                           (cpp_dec_float<200U,_int,_void> *)local_a68);
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_958;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar31 * -8 + 4);
                }
                iStack_978 = iStack_8e8;
                bStack_974 = bStack_8e4;
                local_970 = local_8e0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_9e8,
                           (cpp_dec_float<200U,_int,_void> *)local_d18);
                pnVar7 = (this->rowWeight).data.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
                puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  *puVar19 = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                  puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
                }
                *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_978;
                *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_974;
                *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_970;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_9e8;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar31 * -8 + 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar31 * -8 + 4);
                }
                iStack_978 = iStack_ca8;
                bStack_974 = bStack_ca4;
                local_970 = local_ca0;
                if ((bStack_ca4 == true) && (local_9e8._0_4_ != 0 || SUB84(local_ca0,0) != 0)) {
                  bStack_974 = false;
                }
                puVar17 = (undefined4 *)local_a68;
                puVar11 = (undefined4 *)local_958;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  *puVar11 = *puVar17;
                  puVar17 = puVar17 + (ulong)bVar31 * -2 + 1;
                  puVar11 = puVar11 + (ulong)bVar31 * -2 + 1;
                }
                iStack_8e8 = iStack_9f8;
                bStack_8e4 = bStack_9f4;
                local_8e0 = local_9f0;
                if ((bStack_9f4 == true) && (local_958._0_4_ != 0 || SUB84(local_9f0,0) != 0)) {
                  bStack_8e4 = false;
                }
                if (SUB84(local_9f0,0) == 2 || SUB84(local_ca0,0) == 2) {
                  bVar30 = false;
                }
                else {
                  iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_9e8,
                                      (cpp_dec_float<200U,_int,_void> *)local_958);
                  bVar30 = SUB41((uint)iVar10 >> 0x1f,0);
                }
                (this->rowRight).data[uVar26 - 2] = bVar30;
                goto LAB_005950ef;
              }
            }
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)&(base->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .right.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar24)
            ;
            local_9f0 = 5.94158821470276e-313;
            local_a68 = (undefined1  [16])0x0;
            local_a58 = (undefined1  [16])0x0;
            local_a48 = (undefined1  [16])0x0;
            local_a38 = (undefined1  [16])0x0;
            local_a28 = (undefined1  [16])0x0;
            local_a18 = (undefined1  [16])0x0;
            local_a08[0] = 0;
            local_a08[1] = 0;
            stack0xfffffffffffff600 = 0;
            uStack_9fb = 0;
            iStack_9f8 = 0;
            bStack_9f4 = false;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_858;
            if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_a68) {
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_a68;
              for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar31 * -8 + 4)
                ;
              }
              iStack_9f8 = iStack_7e8;
              bStack_9f4 = bStack_7e4;
              local_9f0 = local_7e0;
              pcVar12 = pcVar18;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_a68,pcVar12);
            puVar19 = (uint *)local_448;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
            }
            iStack_ca8 = local_448._112_4_;
            bStack_ca4 = local_448[0x74];
            local_ca0 = (double)local_448._120_8_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_d18,
                       (cpp_dec_float<200U,_int,_void> *)local_a68);
            pnVar7 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_d18;
            puVar19 = (uint *)((long)&pnVar7[-1].m_backend.data + lVar24);
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar19 = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar31 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar31 * -2 + 1;
            }
            *(int *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = iStack_ca8;
            *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = bStack_ca4;
            *(double *)((long)&(pnVar7->m_backend).data + lVar24 + -8) = local_ca0;
            (this->rowRight).data[uVar26 - 2] = true;
          }
          else {
            pnVar7 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar11 = (undefined4 *)((long)&pnVar7[-1].m_backend.data + lVar24);
            puVar17 = (undefined4 *)local_1b8;
            puVar21 = puVar11;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar21 = *puVar17;
              puVar17 = puVar17 + (ulong)bVar31 * -2 + 1;
              puVar21 = puVar21 + (ulong)bVar31 * -2 + 1;
            }
            *(undefined4 *)((long)&(pnVar7->m_backend).data + lVar24 + -0x10) = local_1b8._112_4_;
            *(bool *)((long)&(pnVar7->m_backend).data + lVar24 + -0xc) = local_1b8[0x74];
            dVar27 = local_140;
LAB_005950eb:
            *(double *)(puVar11 + 0x1e) = dVar27;
          }
        }
LAB_005950ef:
        uVar26 = uVar26 - 1;
        lVar24 = lVar24 + -0x80;
      } while (1 < uVar26);
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}